

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O3

bool __thiscall r_comp::Compiler::op(Compiler *this,Ptr *node,Class *p,ReturnType t)

{
  undefined8 uVar1;
  bool bVar2;
  iterator iVar3;
  
  iVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)this->_metadata,
                 &((node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->cmd);
  if ((iVar3.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_true>
       ._M_cur == (__node_type *)0x0) ||
     ((t != ANY &&
      (*(ReturnType *)
        ((long)iVar3.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_true>
               ._M_cur + 0x68) != ANY &&
       *(ReturnType *)
        ((long)iVar3.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_true>
               ._M_cur + 0x68) != t)))) {
    bVar2 = false;
  }
  else {
    r_code::Atom::operator=
              (&p->atom,(Atom *)((long)iVar3.
                                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_true>
                                       ._M_cur + 0x28));
    std::__cxx11::string::_M_assign((string *)&p->str_opcode);
    std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::operator=
              (&p->things_to_read,
               (vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)
               ((long)iVar3.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_true>
                      ._M_cur + 0x50));
    uVar1 = *(undefined8 *)
             ((long)iVar3.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_true>
                    ._M_cur + 0x68);
    p->type = (int)uVar1;
    p->use_as = (int)((ulong)uVar1 >> 0x20);
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool Compiler::op(RepliStruct::Ptr node, Class &p, const ReturnType t)
{
    std::unordered_map<std::string, Class>::const_iterator it = _metadata->classes.find(node->cmd);

    if (it == _metadata->classes.end() || (t != ANY && it->second.type != ANY && it->second.type != t)) {
        return false;
    }

    p = it->second;
    return true;
}